

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

_Bool ARM_getInstruction(csh ud,uint8_t *code,size_t code_len,MCInst *instr,uint16_t *size,
                        uint64_t address,void *info)

{
  DecodeStatus DVar1;
  size_t in_RCX;
  uint8_t *in_RDX;
  MCInst *in_RSI;
  cs_struct *in_RDI;
  uint16_t *in_R8;
  uint64_t in_R9;
  DecodeStatus status;
  
  DVar1 = _ARM_getInstruction(in_RDI,in_RSI,in_RDX,in_RCX,in_R8,in_R9);
  return DVar1 != MCDisassembler_Fail;
}

Assistant:

bool ARM_getInstruction(csh ud, const uint8_t *code, size_t code_len, MCInst *instr,
		uint16_t *size, uint64_t address, void *info)
{
	DecodeStatus status = _ARM_getInstruction((cs_struct *)ud, instr, code, code_len, size, address);

	//return status == MCDisassembler_Success;
	return status != MCDisassembler_Fail;
}